

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O0

void Timidity::PrintArt(char *type,CONNECTIONLIST *art,CONNECTION *artList)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  uint local_24;
  DWORD i;
  CONNECTION *artList_local;
  CONNECTIONLIST *art_local;
  char *type_local;
  
  printf("%s Connections:\n",type);
  for (local_24 = 0; local_24 < art->cConnections; local_24 = local_24 + 1) {
    pcVar1 = SourceToString(artList[local_24].usSource);
    pcVar2 = SourceToString(artList[local_24].usControl);
    pcVar3 = DestinationToString(artList[local_24].usDestination);
    pcVar4 = TransformToString(artList[local_24].usTransform);
    printf("  Source: %s, Control: %s, Destination: %s, Transform: %s, Scale: %d\n",pcVar1,pcVar2,
           pcVar3,pcVar4,(ulong)(uint)artList[local_24].lScale);
  }
  return;
}

Assistant:

static void PrintArt(const char *type, CONNECTIONLIST *art, CONNECTION *artList)
{
	DWORD i;
	printf("%s Connections:\n", type);
	for ( i = 0; i < art->cConnections; ++i ) {
		printf("  Source: %s, Control: %s, Destination: %s, Transform: %s, Scale: %d\n",
			SourceToString(artList[i].usSource),
			SourceToString(artList[i].usControl),
			DestinationToString(artList[i].usDestination),
			TransformToString(artList[i].usTransform),
			artList[i].lScale);
	}
}